

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::GenerateSmoothingPoints
          (DeadReckoningCalculator *this,WorldCoordinates *StartPosition,
          WorldCoordinates *EndPosition,KUINT32 NumberOfPoints,
          vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
          *v)

{
  KUINT32 KVar1;
  bool bVar2;
  WorldCoordinates delta_loc;
  WorldCoordinates local_90;
  WorldCoordinates local_70;
  WorldCoordinates local_50;
  
  std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ::reserve(v,(ulong)NumberOfPoints);
  DATA_TYPE::WorldCoordinates::operator-(EndPosition,StartPosition);
  if (NumberOfPoints != 0) {
    KVar1 = 1;
    do {
      DATA_TYPE::WorldCoordinates::operator*
                (&local_70,&local_90,(KFLOAT32)((float)(int)KVar1 / (float)NumberOfPoints));
      DATA_TYPE::WorldCoordinates::operator+(StartPosition,&local_70);
      std::
      vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
      ::emplace_back<KDIS::DATA_TYPE::WorldCoordinates>(v,&local_50);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
      bVar2 = KVar1 != NumberOfPoints;
      KVar1 = KVar1 + 1;
    } while (bVar2);
  }
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_90.super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::GenerateSmoothingPoints( const WorldCoordinates & StartPosition, const WorldCoordinates & EndPosition,
                                                       KUINT32 NumberOfPoints, vector<WorldCoordinates> & v)
{
    v.reserve( NumberOfPoints );
    WorldCoordinates delta_loc = EndPosition - StartPosition;

    for( KINT32 i = 1; i <= NumberOfPoints; ++i )
    {
        v.push_back( StartPosition + ( delta_loc *  ( KFLOAT32( i ) / KFLOAT32( NumberOfPoints ) ) ) );
    }
}